

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void __thiscall asmjit::Logger::setIndentation(Logger *this,char *indentation)

{
  void *in_RSI;
  long in_RDI;
  size_t length;
  size_t i;
  ulong local_18;
  
  memset((void *)(in_RDI + 0xc),0,0xc);
  if (in_RSI != (void *)0x0) {
    for (local_18 = 0; (local_18 < 0xb && (*(char *)((long)in_RSI + local_18) != '\0'));
        local_18 = local_18 + 1) {
    }
    memcpy((void *)(in_RDI + 0xc),in_RSI,local_18);
  }
  return;
}

Assistant:

void Logger::setIndentation(const char* indentation) noexcept {
  ::memset(_indentation, 0, ASMJIT_ARRAY_SIZE(_indentation));
  if (!indentation)
    return;

  size_t length = Utils::strLen(indentation, ASMJIT_ARRAY_SIZE(_indentation) - 1);
  ::memcpy(_indentation, indentation, length);
}